

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O3

int flute_wl(int d,int *x,int *y,int acc)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  point *ptp [150];
  int s [150];
  int ys [150];
  int xs [150];
  point pt [150];
  long local_1308 [150];
  int local_e58 [152];
  int local_bf8 [152];
  int local_998 [152];
  int local_738 [452];
  
  if (d == 2) {
    iVar7 = *x - x[1];
    iVar8 = -iVar7;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    iVar12 = *y - y[1];
    iVar7 = -iVar12;
    if (0 < iVar12) {
      iVar7 = iVar12;
    }
    return iVar7 + iVar8;
  }
  if (d != 3) {
    if (0 < d) {
      uVar9 = (ulong)(uint)d;
      piVar10 = local_738;
      uVar13 = 0;
      do {
        *piVar10 = x[uVar13];
        piVar10[1] = y[uVar13];
        local_1308[uVar13] = (long)piVar10;
        uVar13 = uVar13 + 1;
        piVar10 = piVar10 + 3;
      } while (uVar9 != uVar13);
      bVar5 = d != 1;
      if (d == 1) {
        bVar5 = false;
      }
      else {
        uVar14 = 1;
        uVar13 = 0;
        do {
          piVar10 = (int *)local_1308[uVar13];
          uVar1 = uVar13 + 1;
          iVar8 = *piVar10;
          uVar11 = uVar13 & 0xffffffff;
          uVar15 = uVar14;
          do {
            iVar7 = *(int *)local_1308[uVar15];
            if (iVar7 < iVar8) {
              uVar11 = uVar15 & 0xffffffff;
            }
            if (iVar7 <= iVar8) {
              iVar8 = iVar7;
            }
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
          local_1308[uVar13] = local_1308[(int)uVar11];
          local_1308[(int)uVar11] = (long)piVar10;
          uVar14 = uVar14 + 1;
          uVar13 = uVar1;
        } while (uVar1 != d - 1);
      }
      if (0 < d) {
        uVar13 = 0;
        do {
          piVar10 = (int *)local_1308[uVar13];
          local_998[uVar13] = *piVar10;
          piVar10[2] = (int)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      if (bVar5) {
        uVar14 = 1;
        uVar13 = 0;
        do {
          lVar3 = local_1308[uVar13];
          uVar1 = uVar13 + 1;
          iVar8 = *(int *)(lVar3 + 4);
          uVar11 = uVar13 & 0xffffffff;
          uVar15 = uVar14;
          do {
            iVar7 = *(int *)(local_1308[uVar15] + 4);
            if (iVar7 < iVar8) {
              uVar11 = uVar15 & 0xffffffff;
            }
            if (iVar7 <= iVar8) {
              iVar8 = iVar7;
            }
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
          lVar4 = local_1308[(int)uVar11];
          local_bf8[uVar13] = *(int *)(lVar4 + 4);
          local_e58[uVar13] = *(int *)(lVar4 + 8);
          local_1308[(int)uVar11] = lVar3;
          uVar14 = uVar14 + 1;
          uVar13 = uVar1;
        } while (uVar1 != d - 1);
      }
    }
    iVar8 = d + -1;
    lVar3 = local_1308[iVar8];
    local_bf8[iVar8] = *(int *)(lVar3 + 4);
    local_e58[iVar8] = *(int *)(lVar3 + 8);
    if (d < 10) {
      iVar8 = flutes_wl_LD(d,local_998,local_bf8,local_e58);
    }
    else {
      iVar8 = flutes_wl_MD(d,local_998,local_bf8,local_e58,acc);
    }
    return iVar8;
  }
  iVar8 = *x;
  iVar7 = x[1];
  iVar12 = iVar7;
  if (iVar7 < iVar8) {
    iVar12 = iVar8;
  }
  if (iVar8 < iVar7) {
    iVar7 = iVar8;
  }
  iVar8 = x[2];
  if (iVar12 <= iVar8) {
    iVar12 = iVar8;
  }
  if (iVar8 <= iVar7) {
    iVar7 = iVar8;
  }
  iVar8 = *y;
  iVar2 = y[1];
  iVar6 = iVar2;
  if (iVar2 < iVar8) {
    iVar6 = iVar8;
  }
  if (iVar8 < iVar2) {
    iVar2 = iVar8;
  }
  iVar8 = y[2];
  if (iVar6 <= iVar8) {
    iVar6 = iVar8;
  }
  if (iVar8 <= iVar2) {
    iVar2 = iVar8;
  }
  return (iVar6 + iVar12) - (iVar2 + iVar7);
}

Assistant:

DTYPE flute_wl(int d, DTYPE x[], DTYPE y[], int acc)
{
    DTYPE xs[MAXD], ys[MAXD], minval, l, xu, xl, yu, yl;
    int s[MAXD];
    int i, j, k, minidx;
    struct point pt[MAXD], *ptp[MAXD], *tmpp;

    if (d==2)
        l = ADIFF(x[0], x[1]) + ADIFF(y[0], y[1]);
    else if (d==3) {
        if (x[0] > x[1]) {
            xu = max(x[0], x[2]);
            xl = min(x[1], x[2]);
        }
        else {
            xu = max(x[1], x[2]);
            xl = min(x[0], x[2]);
        }
        if (y[0] > y[1]) {
            yu = max(y[0], y[2]);
            yl = min(y[1], y[2]);
        }
        else {
            yu = max(y[1], y[2]);
            yl = min(y[0], y[2]);
        }
        l = (xu-xl) + (yu-yl);
    }
    else {
        for (i=0; i<d; i++) {
            pt[i].x = x[i];
            pt[i].y = y[i];
            ptp[i] = &pt[i];
        }
        
        // sort x
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->x;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->x) {
                    minval = ptp[j]->x;
                    minidx = j;
                }
            }
            tmpp = ptp[i];
            ptp[i] = ptp[minidx];
            ptp[minidx] = tmpp;
        }

#if REMOVE_DUPLICATE_PIN==1
        ptp[d] = &pt[d];
        ptp[d]->x = ptp[d]->y = -999999;
        j = 0;
        for (i=0; i<d; i++) {
            for (k=i+1; ptp[k]->x == ptp[i]->x; k++)
                if (ptp[k]->y == ptp[i]->y)  // pins k and i are the same
                    break;
            if (ptp[k]->x != ptp[i]->x)
                ptp[j++] = ptp[i];
        }
        d = j;
#endif
        
        for (i=0; i<d; i++) {
            xs[i] = ptp[i]->x;
            ptp[i]->o = i;
        }

        // sort y to find s[]
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->y;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->y) {
                    minval = ptp[j]->y;
                    minidx = j;
                }
            }
            ys[i] = ptp[minidx]->y;
            s[i] = ptp[minidx]->o;
            ptp[minidx] = ptp[i];
        }
        ys[d-1] = ptp[d-1]->y;
        s[d-1] = ptp[d-1]->o;
        
        l = flutes_wl(d, xs, ys, s, acc);
    }
    return l;
}